

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O3

_Bool sysbvm_identitySet_findWithExplicitHash
                (sysbvm_context_t *context,sysbvm_tuple_t set,void *element,
                sysbvm_identitySet_explicitHashFunction_t hashFunction,
                sysbvm_identitySet_explicitEqualsFunction_t equalsFunction,
                sysbvm_tuple_t *outFoundElement)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  _Bool _Var3;
  byte bVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  *outFoundElement = 0;
  if ((((set & 0xf) != 0 || set == 0) ||
      (uVar1 = *(ulong *)(set + 0x18), (uVar1 & 0xf) != 0 || uVar1 == 0)) ||
     (*(uint *)(uVar1 + 0xc) < 8)) {
    return false;
  }
  uVar8 = (ulong)(*(uint *)(uVar1 + 0xc) >> 3);
  sVar5 = (*hashFunction)(context,element);
  uVar6 = sVar5 % uVar8;
  uVar7 = uVar6;
  do {
    sVar2 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar7 * 8);
    if (sVar2 == 0x3f) {
      return false;
    }
    _Var3 = (*equalsFunction)(element,sVar2);
    if (_Var3) {
      *outFoundElement = sVar2;
      return true;
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 < uVar8);
  if (uVar6 == 0) {
    bVar9 = false;
    bVar4 = 0;
  }
  else {
    uVar7 = 0;
    do {
      sVar2 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar7 * 8);
      bVar9 = sVar2 == 0x3f;
      if (bVar9) break;
      _Var3 = (*equalsFunction)(element,sVar2);
      if (_Var3) {
        *outFoundElement = sVar2;
        bVar9 = true;
        bVar4 = 1;
        goto LAB_0014000d;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar6);
    bVar4 = 0;
  }
LAB_0014000d:
  return (_Bool)(bVar9 & bVar4);
}

Assistant:

SYSBVM_API bool sysbvm_identitySet_findWithExplicitHash(sysbvm_context_t *context, sysbvm_tuple_t set, void *element, sysbvm_identitySet_explicitHashFunction_t hashFunction, sysbvm_identitySet_explicitEqualsFunction_t equalsFunction, sysbvm_tuple_t *outFoundElement)
{
    *outFoundElement = SYSBVM_NULL_TUPLE;
    if(!sysbvm_tuple_isNonNullPointer(set))
        return false;

    sysbvm_identitySet_t *setObject = (sysbvm_identitySet_t*)set;
    size_t capacity = sysbvm_tuple_getSizeInSlots(setObject->storage);
    if(capacity == 0)
        return false;

    sysbvm_array_t *storage = (sysbvm_array_t*)setObject->storage;
    size_t hashIndex = hashFunction(context, element) % capacity;
    for(size_t i = hashIndex; i < capacity; ++i)
    {
        sysbvm_tuple_t setElement = storage->elements[i];
        if(setElement == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
            return false;
        
        if(equalsFunction(element, setElement))
        {
            *outFoundElement = setElement;
            return true;
        }
    }

    for(size_t i = 0; i < hashIndex; ++i)
    {
        sysbvm_tuple_t setElement = storage->elements[i];
        if(setElement == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
            return false;
        
        if(equalsFunction(element, setElement))
        {
            *outFoundElement = setElement;
            return true;
        }
    }

    return false;
}